

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  pointer pBVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  pointer pMVar8;
  size_t sVar9;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  bool bVar10;
  undefined1 auVar11 [16];
  pointer pvVar12;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar13;
  int iVar14;
  int iVar15;
  pointer pfVar16;
  ulong uVar17;
  BBoxRect *__args;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  void *pvVar22;
  float *pfVar23;
  ulong uVar24;
  int j;
  ulong uVar25;
  uint uVar26;
  float *pfVar27;
  long lVar28;
  float *pfVar29;
  float fVar30;
  float extraout_XMM0_Db;
  float fVar32;
  undefined1 auVar31 [16];
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> bbox_scores;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<float,_std::allocator<float>_> local_1f8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1d8;
  undefined1 local_1b8 [16];
  float *local_1a8;
  Yolov3DetectionOutput *local_198;
  float local_18c;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_188;
  ulong local_168;
  long local_160;
  vector<float,_std::allocator<float>_> local_158;
  float local_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  ulong local_120;
  ulong local_118;
  float *local_110;
  float local_108;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f0;
  Option *local_e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e0;
  long local_d8;
  long local_d0;
  pointer local_c8;
  long local_c0;
  void *local_b8;
  ulong local_b0;
  void *local_a8;
  float *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  undefined1 extraout_var [12];
  
  local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f0 = top_blobs;
  local_e8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_168 = 0;
    local_198 = this;
    local_e0 = bottom_blobs;
    do {
      pvVar13 = local_e0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                *)&local_1f8,(long)this->num_box);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(&local_1d8,(long)this->num_box);
      pMVar8 = (pvVar13->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar15 = this->num_box;
      iVar14 = pMVar8[local_168].c / iVar15;
      if (iVar14 != this->num_class + 5) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_1d8);
        std::
        vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                   *)&local_1f8);
        iVar15 = -1;
        goto LAB_00168378;
      }
      if (0 < iVar15) {
        local_c8 = pMVar8 + local_168;
        uVar19._0_4_ = pMVar8[local_168].w;
        uVar19._4_4_ = pMVar8[local_168].h;
        auVar35._0_4_ = (float)(int)(undefined4)uVar19;
        auVar35._4_4_ = (float)(int)uVar19._4_4_;
        auVar35._8_8_ = 0;
        auVar37 = rcpps(in_XMM2,auVar35);
        fVar30 = *(float *)((long)(this->anchors_scale).data + local_168 * 4);
        local_88 = auVar37._0_4_;
        fStack_84 = auVar37._4_4_;
        fStack_80 = auVar37._8_4_;
        fStack_7c = auVar37._12_4_;
        local_88 = (1.0 - auVar35._0_4_ * local_88) * local_88 + local_88;
        fStack_84 = (1.0 - auVar35._4_4_ * fStack_84) * fStack_84 + fStack_84;
        fStack_80 = (0.0 - fStack_80 * 0.0) * fStack_80 + fStack_80;
        fStack_7c = (0.0 - fStack_7c * 0.0) * fStack_7c + fStack_7c;
        auVar34._0_4_ = (int)(fVar30 * auVar35._0_4_);
        auVar34._4_4_ = (int)(fVar30 * auVar35._4_4_);
        auVar34._8_4_ = (int)(fVar30 * 0.0);
        auVar34._12_4_ = (int)(fVar30 * 0.0);
        in_XMM2._4_4_ = uVar19._4_4_;
        in_XMM2._0_4_ = uVar19._4_4_;
        in_XMM2._8_4_ = uVar19._4_4_;
        in_XMM2._12_4_ = uVar19._4_4_;
        local_120 = (ulong)(uint)uVar19._4_4_;
        local_118 = uVar19 & 0xffffffff;
        auVar37._0_4_ = (float)auVar34._0_4_;
        auVar37._4_4_ = (float)auVar34._4_4_;
        auVar37._8_4_ = (float)auVar34._8_4_;
        auVar37._12_4_ = (float)auVar34._12_4_;
        auVar35 = rcpps(auVar34,auVar37);
        local_98 = auVar35._0_4_;
        fStack_94 = auVar35._4_4_;
        fStack_90 = auVar35._8_4_;
        fStack_8c = auVar35._12_4_;
        local_98 = (1.0 - auVar37._0_4_ * local_98) * local_98 + local_98;
        fStack_94 = (1.0 - auVar37._4_4_ * fStack_94) * fStack_94 + fStack_94;
        fStack_90 = (0.0 - auVar37._8_4_ * fStack_90) * fStack_90 + fStack_90;
        fStack_8c = (0.0 - auVar37._12_4_ * fStack_8c) * fStack_8c + fStack_8c;
        local_d8 = (long)iVar14;
        local_d0 = (long)iVar15 * local_168 * 4;
        local_160 = 0;
        do {
          if (0 < (int)local_120) {
            lVar20 = local_160 * local_d8;
            sVar9 = local_c8->cstep;
            pvVar22 = local_c8->data;
            uVar19 = local_c8->elemsize;
            local_b8 = (void *)((lVar20 + 5) * sVar9 * uVar19 + (long)pvVar22);
            uVar24 = (long)local_c8->h * (long)local_c8->w * uVar19 + 0xf & 0xfffffffffffffff0;
            pfVar23 = (float *)((lVar20 + 4) * sVar9 * uVar19 + (long)pvVar22);
            local_110 = (float *)((lVar20 + 3) * sVar9 * uVar19 + (long)pvVar22);
            pfVar29 = (float *)((lVar20 + 2) * sVar9 * uVar19 + (long)pvVar22);
            pfVar27 = (float *)((lVar20 + 1) * sVar9 * uVar19 + (long)pvVar22);
            pfVar21 = (float *)(lVar20 * sVar9 * uVar19 + (long)pvVar22);
            uVar6 = *(undefined8 *)
                     ((long)(this->biases).data +
                     (long)((int)*(float *)((long)(this->mask).data + local_160 * 4 + local_d0) * 2)
                     * 4);
            local_78 = (float)uVar6 * 0.5;
            fStack_74 = (float)((ulong)uVar6 >> 0x20) * 0.5;
            uStack_70 = 0;
            uStack_6c = 0;
            local_c0 = uVar19 * (long)local_c8->w;
            uVar25 = 0;
            do {
              local_b0 = uVar25;
              if (0 < (int)local_118) {
                local_a8 = (void *)(uVar25 * local_c0 + (long)local_b8);
                local_68 = ZEXT416((uint)(float)(int)uVar25);
                uVar25 = 0;
                do {
                  local_a0 = pfVar23;
                  local_138 = expf(-*pfVar23);
                  local_138 = local_138 + 1.0;
                  if ((long)local_198->num_class < 1) {
                    iVar15 = 0;
                    fVar30 = -3.4028235e+38;
                  }
                  else {
                    uVar17 = 0;
                    uVar18 = 0;
                    fVar30 = -3.4028235e+38;
                    do {
                      fVar32 = *(float *)((long)local_a8 +
                                         (uVar24 - uVar24 % uVar19) * uVar17 + uVar25 * 4);
                      bVar10 = fVar30 < fVar32;
                      if (fVar30 <= fVar32) {
                        fVar30 = fVar32;
                      }
                      if (bVar10) {
                        uVar18 = uVar17 & 0xffffffff;
                      }
                      iVar15 = (int)uVar18;
                      uVar17 = uVar17 + 1;
                    } while ((long)local_198->num_class != uVar17);
                  }
                  fVar30 = expf(-fVar30);
                  local_18c = 1.0 / ((fVar30 + 1.0) * local_138);
                  if (local_198->confidence_threshold <= local_18c) {
                    local_138 = (float)(int)uVar25;
                    fStack_134 = (float)local_68._0_4_;
                    fStack_130 = 0.0;
                    fStack_12c = (float)local_68._4_4_;
                    local_13c = *pfVar29;
                    local_108 = *local_110;
                    local_58 = -*pfVar21;
                    fStack_54 = -*pfVar27;
                    uStack_50 = 0x80000000;
                    uStack_4c = 0x80000000;
                    local_48 = expf(local_58);
                    fStack_44 = extraout_XMM0_Db;
                    auVar31._0_4_ = expf(fStack_54);
                    auVar31._4_12_ = extraout_var;
                    auVar38._0_4_ = local_48 + 1.0;
                    auVar38._4_4_ = auVar31._0_4_ + 1.0;
                    auVar38._8_4_ = fStack_44 + 0.0;
                    auVar38._12_4_ = extraout_var._0_4_ + 0.0;
                    auVar37 = rcpps(auVar31,auVar38);
                    fVar30 = auVar37._0_4_;
                    fVar32 = auVar37._4_4_;
                    fVar33 = auVar37._8_4_;
                    fVar36 = auVar37._12_4_;
                    local_138 = (local_138 + fVar30 + (1.0 - auVar38._0_4_ * fVar30) * fVar30) *
                                local_88;
                    fStack_134 = (fStack_134 + fVar32 + (1.0 - auVar38._4_4_ * fVar32) * fVar32) *
                                 fStack_84;
                    fStack_130 = (fStack_130 + fVar33 + (0.0 - auVar38._8_4_ * fVar33) * fVar33) *
                                 fStack_80;
                    fStack_12c = (fStack_12c + fVar36 + (0.0 - auVar38._12_4_ * fVar36) * fVar36) *
                                 fStack_7c;
                    local_108 = expf(local_108);
                    fVar30 = expf(local_13c);
                    lVar20 = local_160;
                    fVar30 = fVar30 * local_78 * local_98;
                    fVar32 = local_108 * fStack_74 * fStack_94;
                    in_XMM2._4_4_ = fStack_134;
                    in_XMM2._0_4_ = local_138;
                    in_XMM2._8_4_ = fStack_130;
                    in_XMM2._12_4_ = fStack_12c;
                    fVar33 = local_138 - fVar30;
                    fVar36 = fStack_134 - fVar32;
                    fVar30 = fVar30 + local_138;
                    fVar32 = fVar32 + fStack_134;
                    local_1b8 = CONCAT88(CONCAT44(fVar32,fVar30),CONCAT44(fVar36,fVar33));
                    local_1a8 = (float *)CONCAT44(local_1a8._4_4_,iVar15);
                    this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                              (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + local_160 * 6);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                      _M_realloc_insert<ncnn::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_1b8);
                    }
                    else {
                      (__position._M_current)->label = iVar15;
                      (__position._M_current)->xmin = fVar33;
                      (__position._M_current)->ymin = fVar36;
                      (__position._M_current)->xmax = fVar30;
                      (__position._M_current)->ymax = fVar32;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                    }
                    this_01 = (vector<float,std::allocator<float>> *)
                              (local_1d8.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar20);
                    __position_00._M_current = *(float **)(this_01 + 8);
                    if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                (this_01,__position_00,&local_18c);
                    }
                    else {
                      *__position_00._M_current = local_18c;
                      *(float **)(this_01 + 8) = __position_00._M_current + 1;
                    }
                  }
                  pfVar21 = pfVar21 + 1;
                  pfVar27 = pfVar27 + 1;
                  pfVar29 = pfVar29 + 1;
                  local_110 = local_110 + 1;
                  pfVar23 = local_a0 + 1;
                  uVar25 = uVar25 + 1;
                } while (uVar25 != local_118);
              }
              uVar25 = local_b0 + 1;
            } while (uVar25 != local_120);
            iVar15 = local_198->num_box;
            this = local_198;
          }
          local_160 = local_160 + 1;
        } while (local_160 < iVar15);
        if (0 < iVar15) {
          lVar20 = 8;
          lVar28 = 0;
          do {
            pvVar12 = local_1d8.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                      ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_188,
                       local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar20 + -8),
                       *(undefined8 *)
                        ((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar20));
            std::vector<float,std::allocator<float>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                      ((vector<float,std::allocator<float>> *)&local_158,
                       local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       *(undefined8 *)((long)pvVar12 + lVar20 + -8),
                       *(undefined8 *)
                        ((long)&(pvVar12->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                .super__Vector_impl_data._M_start + lVar20));
            lVar28 = lVar28 + 1;
            lVar20 = lVar20 + 0x18;
          } while (lVar28 < this->num_box);
        }
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1d8);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                 *)&local_1f8);
      local_168 = local_168 + 1;
    } while (local_168 <
             (ulong)((long)(local_e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 6));
    if ((local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::BBoxRect>
                (&local_188,&local_158,0,
                 (int)((ulong)((long)local_158.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_158.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  pBVar2 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar1 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1d8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = (Yolov3DetectionOutput *)CONCAT44(local_198._4_4_,this->nms_threshold);
  uVar19 = ((long)local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  std::vector<float,_std::allocator<float>_>::vector(&local_1f8,uVar19,(allocator_type *)local_1b8);
  if (pBVar2 != pBVar1) {
    pfVar21 = &(local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start)->xmax;
    lVar20 = 0;
    do {
      uVar5 = ((BBoxRect *)(pfVar21 + -2))->xmin;
      uVar7 = ((BBoxRect *)(pfVar21 + -2))->ymin;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar20] =
           ((float)((ulong)*(undefined8 *)pfVar21 >> 0x20) - (float)uVar7) *
           ((float)*(undefined8 *)pfVar21 - (float)uVar5);
      lVar20 = lVar20 + 1;
      pfVar21 = pfVar21 + 5;
    } while (uVar19 + (uVar19 == 0) != lVar20);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_1b8._8_8_;
    local_1b8 = auVar11 << 0x40;
    uVar25 = 0;
    do {
      uVar26 = (uint)((ulong)((long)local_1d8.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1d8.
                                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((int)uVar26 < 1) {
LAB_00168113:
        if (local_1d8.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1d8.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1d8,
                     (iterator)
                     local_1d8.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1b8);
        }
        else {
          *(ulong *)local_1d8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = uVar25;
          local_1d8.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_1d8.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
        }
      }
      else {
        pBVar1 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar25;
        fVar30 = pBVar1->xmin;
        bVar10 = true;
        uVar24 = 0;
        do {
          pfVar16 = (&((local_1d8.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start)[uVar24];
          fVar32 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pfVar16].xmax;
          fVar33 = 0.0;
          if (fVar30 <= fVar32) {
            pBVar2 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)pfVar16;
            fVar36 = pBVar1->xmax;
            fVar40 = pBVar2->xmin;
            if (fVar40 <= fVar36) {
              fVar3 = pBVar1->ymin;
              fVar39 = pBVar2->ymax;
              if (fVar3 <= fVar39) {
                fVar4 = pBVar1->ymax;
                fVar41 = pBVar2->ymin;
                if (fVar41 <= fVar4) {
                  if (fVar36 <= fVar32) {
                    fVar32 = fVar36;
                  }
                  if (fVar40 <= fVar30) {
                    fVar40 = fVar30;
                  }
                  if (fVar4 <= fVar39) {
                    fVar39 = fVar4;
                  }
                  if (fVar41 <= fVar3) {
                    fVar41 = fVar3;
                  }
                  fVar33 = (fVar39 - fVar41) * (fVar32 - fVar40);
                }
              }
            }
          }
          if (local_198._0_4_ <
              fVar33 / ((local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar25] - fVar33) +
                       local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)pfVar16])) {
            bVar10 = false;
          }
          uVar24 = uVar24 + 1;
        } while ((uVar26 & 0x7fffffff) != uVar24);
        if (bVar10) goto LAB_00168113;
      }
      uVar25 = local_1b8._0_8_ + 1;
      local_1b8._0_8_ = uVar25;
    } while (uVar25 < uVar19);
  }
  if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1a8 = (float *)0x0;
  local_1b8 = ZEXT816(0);
  iVar15 = 0;
  pvVar22 = (void *)0x0;
  if (local_1d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar19 = 0;
    do {
      pfVar16 = (&((local_1d8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
                  ._M_start)[uVar19];
      __args = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
               .super__Vector_impl_data._M_start + (long)pfVar16;
      if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_realloc_insert<ncnn::BBoxRect_const&>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1f8,
                   (iterator)
                   local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *(int *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x10) = __args->label;
        fVar30 = __args->ymin;
        uVar6 = *(undefined8 *)&__args->xmax;
        local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[0] = __args->xmin;
        local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[1] = fVar30;
        *(undefined8 *)
         ((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) = uVar6;
        local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 0x14);
      }
      if ((float *)local_1b8._8_8_ == local_1a8) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)local_1b8,(iterator)local_1b8._8_8_,
                   local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)pfVar16);
      }
      else {
        *(float *)local_1b8._8_8_ =
             local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pfVar16];
        local_1b8._8_8_ = (float *)(local_1b8._8_8_ + 4);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)((long)local_1d8.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1d8.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    uVar26 = (int)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    iVar15 = 0;
    if (uVar26 != 0) {
      this_02 = (local_f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar26,4,local_e8->blob_allocator);
      iVar15 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar15 = 0, 0 < (int)uVar26)) {
        iVar14 = this_02->w;
        sVar9 = this_02->elemsize;
        pfVar21 = (float *)((long)this_02->data + 0x14);
        pfVar16 = local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        iVar15 = 0;
        uVar19 = 0;
        do {
          fVar30 = *(float *)(local_1b8._0_8_ + uVar19 * 4);
          pfVar21[-5] = (float)((int)*pfVar16 + 1);
          pfVar21[-4] = fVar30;
          pfVar21[-3] = pfVar16[-4];
          pfVar21[-2] = pfVar16[-3];
          pfVar21[-1] = pfVar16[-2];
          *pfVar21 = pfVar16[-1];
          uVar19 = uVar19 + 1;
          pfVar21 = (float *)((long)pfVar21 + (long)iVar14 * sVar9);
          pfVar16 = pfVar16 + 5;
        } while ((uVar26 & 0x7fffffff) != uVar19);
      }
    }
    pvVar22 = (void *)local_1b8._0_8_;
  }
  if (pvVar22 != (void *)0x0) {
    operator_delete(pvVar22,(long)local_1a8 - (long)pvVar22);
  }
  if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00168378:
  if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar15;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
#pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {


                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -std::numeric_limits<float>::max();
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
                    class_score = sigmoid(class_score);

                    //printf( "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                                            // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;
                        
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }



        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }

    }
    

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1);// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}